

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

xml_output * attrTagT(xml_output *__return_storage_ptr__,char *name,triState v)

{
  char *ch;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (v == unset) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      noxml();
      return __return_storage_ptr__;
    }
  }
  else {
    QString::QString((QString *)&local_40,name);
    ch = "false";
    if (v == _True) {
      ch = "true";
    }
    QString::QString((QString *)&QStack_58,ch);
    tagValue(__return_storage_ptr__,(QString *)&local_40,(QString *)&QStack_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline XmlOutput::xml_output attrTagT(const char *name, const triState v)
{
    if(v == unset)
        return noxml();
    return tagValue(name, (v == _True ? "true" : "false"));
}